

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this)

{
  reference ppBVar1;
  uint uVar2;
  
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameCollaborativeGraphical_005d8300;
  for (uVar2 = 0;
      (long)(this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar2; uVar2 = uVar2 + 1) {
    ppBVar1 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at(&this->_m_LRFs,(ulong)uVar2);
    if (*ppBVar1 != (value_type)0x0) {
      (*((*ppBVar1)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[1])();
    }
  }
  if (this->_m_jt_pd != (PDDiscreteInterface *)0x0) {
    (**(code **)(*(long *)this->_m_jt_pd + 8))();
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agentScopes);
  std::_Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
  ~_Vector_base(&(this->_m_LRFs).
                 super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
               );
  BayesianGameBase::~BayesianGameBase((BayesianGameBase *)this);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);

    if(_m_jt_pd)
        delete _m_jt_pd;
}